

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Slider.cxx
# Opt level: O3

void __thiscall Fl_Nice_Slider::Fl_Nice_Slider(Fl_Nice_Slider *this,int X,int Y,int W,int H,char *L)

{
  Fl_Valuator::Fl_Valuator((Fl_Valuator *)this,X,Y,W,H,L);
  *(undefined4 *)&(this->super_Fl_Slider).super_Fl_Valuator.field_0xa4 = 0;
  (this->super_Fl_Slider).slider_ = '\0';
  (this->super_Fl_Slider).super_Fl_Valuator.super_Fl_Widget._vptr_Fl_Widget =
       (_func_int **)&PTR__Fl_Widget_00279468;
  (this->super_Fl_Slider).super_Fl_Valuator.super_Fl_Widget.type_ = '\x04';
  (this->super_Fl_Slider).super_Fl_Valuator.super_Fl_Widget.box_ = '\x01';
  return;
}

Assistant:

Fl_Nice_Slider::Fl_Nice_Slider(int X,int Y,int W,int H,const char *L)
: Fl_Slider(X,Y,W,H,L) {
  type(FL_VERT_NICE_SLIDER); 
  box(FL_FLAT_BOX);
}